

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::TypeParameterSymbol::serializeTo(TypeParameterSymbol *this,ASTSerializer *serializer)

{
  Type *__n;
  
  __n = DeclaredType::getType(&this->targetType);
  ASTSerializer::write(serializer,4,"type",(size_t)__n);
  ASTSerializer::write(serializer,7,"isLocal",(ulong)(this->super_ParameterSymbolBase).isLocal);
  ASTSerializer::write(serializer,6,"isPort",(ulong)(this->super_ParameterSymbolBase).isPort);
  ASTSerializer::write(serializer,6,"isBody",(ulong)((this->super_ParameterSymbolBase).isPort ^ 1));
  return;
}

Assistant:

void TypeParameterSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("type", targetType.getType());
    serializer.write("isLocal", isLocalParam());
    serializer.write("isPort", isPortParam());
    serializer.write("isBody", isBodyParam());
}